

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdquery.cc
# Opt level: O1

void __thiscall
bdQuery::bdQuery(bdQuery *this,bdNodeId *id,list<bdId,_std::allocator<bdId>_> *startList,
                uint32_t queryFlags,bdDhtFunctions *fns)

{
  _Rb_tree_header *p_Var1;
  undefined8 uVar2;
  in_port_t iVar3;
  in_addr iVar4;
  uint uVar5;
  time_t tVar6;
  long lVar7;
  bdId *pbVar8;
  bdPeer *pbVar9;
  _List_node_base *p_Var10;
  byte bVar11;
  bdMetric dist;
  uchar local_fc [8];
  uchar auStack_f4 [8];
  uchar local_ec [4];
  bdId local_e8;
  undefined8 local_c4;
  undefined8 uStack_bc;
  undefined4 local_b4;
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  undefined4 uStack_a8;
  pair<bdMetric,_bdPeer> local_98;
  
  bVar11 = 0;
  p_Var1 = &(this->mClosest)._M_t._M_impl.super__Rb_tree_header;
  (this->mClosest)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->mClosest)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->mClosest)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->mClosest)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->mClosest)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->mPotentialPeers)._M_t._M_impl.super__Rb_tree_header;
  (this->mPotentialPeers)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->mPotentialPeers)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->mPotentialPeers)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->mPotentialPeers)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header
  ;
  (this->mPotentialPeers)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->mProxiesUnknown).super__List_base<bdPeer,_std::allocator<bdPeer>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)&this->mProxiesUnknown;
  (this->mProxiesUnknown).super__List_base<bdPeer,_std::allocator<bdPeer>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)&this->mProxiesUnknown;
  (this->mProxiesUnknown).super__List_base<bdPeer,_std::allocator<bdPeer>_>._M_impl._M_node._M_size
       = 0;
  (this->mProxiesFlagged).super__List_base<bdPeer,_std::allocator<bdPeer>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)&this->mProxiesFlagged;
  (this->mProxiesFlagged).super__List_base<bdPeer,_std::allocator<bdPeer>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)&this->mProxiesFlagged;
  (this->mProxiesFlagged).super__List_base<bdPeer,_std::allocator<bdPeer>_>._M_impl._M_node._M_size
       = 0;
  uVar2 = *(undefined8 *)(id->data + 8);
  *(undefined8 *)(this->mId).data = *(undefined8 *)id->data;
  *(undefined8 *)((this->mId).data + 8) = uVar2;
  *(undefined4 *)((this->mId).data + 0x10) = *(undefined4 *)(id->data + 0x10);
  this->mFns = fns;
  tVar6 = time((time_t *)0x0);
  p_Var10 = (startList->super__List_base<bdId,_std::allocator<bdId>_>)._M_impl._M_node.
            super__List_node_base._M_next;
  if (p_Var10 != (_List_node_base *)startList) {
    do {
      bdId::bdId(&local_e8);
      local_b4 = 0;
      uStack_a8 = 0;
      local_c4 = 0;
      uStack_bc = 0;
      uStack_b0 = (undefined4)tVar6;
      uStack_ac = (undefined4)((ulong)tVar6 >> 0x20);
      local_e8.addr._0_4_ = *(undefined4 *)&p_Var10[1]._M_next;
      local_e8.addr.sin_addr.s_addr = *(in_addr_t *)((long)&p_Var10[1]._M_next + 4);
      local_e8.addr.sin_zero._0_4_ = *(undefined4 *)&p_Var10[1]._M_prev;
      local_e8.addr.sin_zero._4_4_ = *(undefined4 *)((long)&p_Var10[1]._M_prev + 4);
      local_e8.id.data._0_4_ = *(undefined4 *)&p_Var10[2]._M_next;
      local_e8.id.data._4_4_ = *(undefined4 *)((long)&p_Var10[2]._M_next + 4);
      local_e8.id.data._8_4_ = *(undefined4 *)&p_Var10[2]._M_prev;
      local_e8.id.data._12_4_ = *(undefined4 *)((long)&p_Var10[2]._M_prev + 4);
      local_e8.id.data._16_4_ = *(undefined4 *)&p_Var10[3]._M_next;
      (*this->mFns->_vptr_bdDhtFunctions[4])(this->mFns,this,&local_e8.id,local_fc);
      local_98.first.super_bdNodeId.data[0x10] = local_ec[0];
      local_98.first.super_bdNodeId.data[0x11] = local_ec[1];
      local_98.first.super_bdNodeId.data[0x12] = local_ec[2];
      local_98.first.super_bdNodeId.data[0x13] = local_ec[3];
      local_98.first.super_bdNodeId.data[0] = local_fc[0];
      local_98.first.super_bdNodeId.data[1] = local_fc[1];
      local_98.first.super_bdNodeId.data[2] = local_fc[2];
      local_98.first.super_bdNodeId.data[3] = local_fc[3];
      local_98.first.super_bdNodeId.data[4] = local_fc[4];
      local_98.first.super_bdNodeId.data[5] = local_fc[5];
      local_98.first.super_bdNodeId.data[6] = local_fc[6];
      local_98.first.super_bdNodeId.data[7] = local_fc[7];
      local_98.first.super_bdNodeId.data[8] = auStack_f4[0];
      local_98.first.super_bdNodeId.data[9] = auStack_f4[1];
      local_98.first.super_bdNodeId.data[10] = auStack_f4[2];
      local_98.first.super_bdNodeId.data[0xb] = auStack_f4[3];
      local_98.first.super_bdNodeId.data[0xc] = auStack_f4[4];
      local_98.first.super_bdNodeId.data[0xd] = auStack_f4[5];
      local_98.first.super_bdNodeId.data[0xe] = auStack_f4[6];
      local_98.first.super_bdNodeId.data[0xf] = auStack_f4[7];
      pbVar8 = &local_e8;
      pbVar9 = &local_98.second;
      for (lVar7 = 9; lVar7 != 0; lVar7 = lVar7 + -1) {
        iVar3 = (pbVar8->addr).sin_port;
        iVar4.s_addr = (pbVar8->addr).sin_addr.s_addr;
        (pbVar9->mPeerId).addr.sin_family = (pbVar8->addr).sin_family;
        (pbVar9->mPeerId).addr.sin_port = iVar3;
        (pbVar9->mPeerId).addr.sin_addr = (in_addr)iVar4.s_addr;
        pbVar8 = (bdId *)((long)pbVar8 + (ulong)bVar11 * -0x10 + 8);
        pbVar9 = (bdPeer *)((long)pbVar9 + ((ulong)bVar11 * -2 + 1) * 8);
      }
      std::
      _Rb_tree<bdMetric,std::pair<bdMetric_const,bdPeer>,std::_Select1st<std::pair<bdMetric_const,bdPeer>>,std::less<bdMetric>,std::allocator<std::pair<bdMetric_const,bdPeer>>>
      ::_M_emplace_equal<std::pair<bdMetric,bdPeer>>
                ((_Rb_tree<bdMetric,std::pair<bdMetric_const,bdPeer>,std::_Select1st<std::pair<bdMetric_const,bdPeer>>,std::less<bdMetric>,std::allocator<std::pair<bdMetric_const,bdPeer>>>
                  *)&this->mClosest,&local_98);
      p_Var10 = (((_List_base<bdId,_std::allocator<bdId>_> *)&p_Var10->_M_next)->_M_impl)._M_node.
                super__List_node_base._M_next;
    } while (p_Var10 != (_List_node_base *)startList);
  }
  this->mState = 2;
  this->mQueryFlags = queryFlags;
  this->mQueryTS = tVar6;
  this->mSearchTime = 0;
  uVar5 = (*this->mFns->_vptr_bdDhtFunctions[2])();
  this->mClosestListSize = (int)((double)(uVar5 & 0xffff) * 1.5);
  this->mPotPeerCleanTS = tVar6;
  this->mQueryIdlePeerRetryPeriod = 600;
  this->mRequiredPeerFlags = 0x200;
  bdZeroNodeId(&(this->mLimit).super_bdNodeId);
  return;
}

Assistant:

bdQuery::bdQuery(const bdNodeId *id, std::list<bdId> &startList, uint32_t queryFlags, 
		bdDhtFunctions *fns) {
	/* */
	mId = *id;
	mFns = fns;

	time_t now = time(NULL);
	std::list<bdId>::iterator it;
	for (it = startList.begin(); it != startList.end(); it++) {
		bdPeer peer;
		peer.mLastSendTime = 0;
		peer.mLastRecvTime = 0;
		peer.mPeerFlags = 0;
		peer.mFoundTime = now;
		peer.mPeerId = *it;

		bdMetric dist;

		mFns->bdDistance(&mId, &(peer.mPeerId.id), &dist);

		mClosest.insert(std::pair<bdMetric, bdPeer>(dist, peer));


	}

	mState = BITDHT_QUERY_QUERYING;
	mQueryFlags = queryFlags;
	mQueryTS = now;
	mSearchTime = 0;
	mClosestListSize = (int) (1.5 * mFns->bdNumQueryNodes());
	mPotPeerCleanTS = now;

	mQueryIdlePeerRetryPeriod = QUERY_IDLE_RETRY_PEER_PERIOD;
	mRequiredPeerFlags = BITDHT_PEER_STATUS_DHT_ENGINE_VERSION; // XXX to update later.

	/* setup the limit of the search
	 * by default it is setup to 000000 = exact match
	 */
	bdZeroNodeId(&mLimit);
}